

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

void embree::sse2::splitPrimitive<embree::sse2::TriangleSplitter>
               (TriangleSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  byte bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar18;
  uint uVar19;
  undefined1 auVar17 [16];
  float fVar20;
  float __x;
  uint uVar21;
  float __x_00;
  float __x_01;
  uint uVar23;
  float __x_02;
  float fVar24;
  uint uVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_e0;
  undefined1 local_d0 [16];
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_90;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  
  if (splitprims == 1) {
    uVar21 = *numSubPrims;
    *numSubPrims = uVar21 + 1;
  }
  else {
    local_a0 = (prim->lower).field_0.m128[0];
    fStack_9c = (prim->lower).field_0.m128[1];
    fStack_98 = (prim->lower).field_0.m128[2];
    fStack_94 = (prim->lower).field_0.m128[3];
    fVar15 = (grid->base).field_0.m128[0];
    fVar16 = (grid->base).field_0.m128[1];
    fVar24 = (grid->base).field_0.m128[2];
    fVar14 = grid->scale;
    fVar20 = (local_a0 - fVar15) * fVar14 + 0.2;
    __x_00 = (fStack_9c - fVar16) * fVar14 + 0.2;
    __x_02 = (fStack_98 - fVar24) * fVar14 + 0.2;
    local_b0 = (prim->upper).field_0.m128[0];
    fStack_ac = (prim->upper).field_0.m128[1];
    fStack_a8 = (prim->upper).field_0.m128[2];
    fStack_a4 = (prim->upper).field_0.m128[3];
    __x = (local_b0 - fVar15) * fVar14 + -0.2;
    __x_01 = (fStack_ac - fVar16) * fVar14 + -0.2;
    fVar24 = (fStack_a8 - fVar24) * fVar14 + -0.2;
    fVar14 = floorf(__x_02);
    fVar15 = floorf(fVar20);
    fVar16 = floorf(__x_00);
    fVar15 = (float)(int)fVar15;
    uVar18 = (uint)fVar16;
    uVar19 = (uint)fVar14;
    fVar14 = floorf(fVar24);
    local_90 = floorf(__x);
    fVar16 = floorf(__x_01);
    uVar21 = -(uint)((int)fVar20 < (int)__x);
    uVar23 = -(uint)((int)__x_00 < (int)__x_01);
    uVar25 = -(uint)((int)__x_02 < (int)fVar24);
    local_e0.m128[0] = (float)(~uVar21 & (uint)fVar15 | (int)local_90 & uVar21);
    local_e0.m128[1] = (float)(~uVar23 & uVar18 | (int)fVar16 & uVar23);
    local_e0.m128[2] = (float)(~uVar25 & uVar19 | (int)fVar14 & uVar25);
    local_e0.m128[3] = 0.0;
    uVar21 = ((int)fVar15 << 0x10 | (uint)fVar15) & 0x30000ff;
    uVar23 = (uVar21 << 8 | uVar21) & 0x300f00f;
    uVar21 = (uVar18 << 0x10 | uVar18) & 0x30000ff;
    uVar18 = (uVar21 << 8 | uVar21) & 0x300f00f;
    uVar21 = (uVar19 << 0x10 | uVar19) & 0x30000ff;
    uVar21 = (uVar21 << 8 | uVar21) & 0x300f00f;
    uVar21 = ((uVar21 << 4 | uVar21) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar18 << 4 | uVar18) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar23 << 4 | uVar23) & 0x30c30c3) * 5 & 0x9249249;
    uVar23 = ((int)local_e0.m128[0] << 0x10 | (uint)local_e0.m128[0]) & 0x30000ff;
    uVar18 = (uVar23 << 8 | uVar23) & 0x300f00f;
    uVar23 = ((int)local_e0.m128[1] << 0x10 | (uint)local_e0.m128[1]) & 0x30000ff;
    uVar19 = (uVar23 << 8 | uVar23) & 0x300f00f;
    uVar23 = ((int)local_e0.m128[2] << 0x10 | (uint)local_e0.m128[2]) & 0x30000ff;
    uVar23 = (uVar23 << 8 | uVar23) & 0x300f00f;
    uVar23 = ((uVar23 << 4 | uVar23) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar19 << 4 | uVar19) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar18 << 4 | uVar18) & 0x30c30c3) * 5 & 0x9249249;
    if (uVar21 == uVar23) {
      uVar12 = 0;
    }
    else {
      uVar18 = 0x1f;
      if ((uVar23 ^ uVar21) != 0) {
        for (; (uVar23 ^ uVar21) >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar12 = (ulong)(uVar18 % 3);
      uVar13 = (ulong)(uVar18 % 3 << 2);
      bVar10 = (byte)(uVar18 / 3);
      fVar15 = (float)((*(uint *)((long)&local_e0 + uVar13) >> (bVar10 & 0x1f)) << (bVar10 & 0x1f))
               * 0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar13);
    }
    if (uVar21 != uVar23) {
      lVar11 = 0;
      auVar17 = _DAT_01feba00;
      auVar22 = _DAT_01feb9f0;
      auVar26 = _DAT_01feba00;
      auVar27 = _DAT_01feb9f0;
      do {
        fVar14 = *(float *)((long)&splitter->v[0].field_0 + lVar11 + uVar12 * 4);
        if (fVar14 <= fVar15) {
          auVar28 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar11);
          auVar27 = minps(auVar27,auVar28);
          auVar26 = maxps(auVar26,auVar28);
        }
        if (fVar15 <= fVar14) {
          auVar28 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar11);
          auVar22 = minps(auVar22,auVar28);
          auVar17 = maxps(auVar17,auVar28);
        }
        fVar16 = *(float *)((long)&splitter->v[1].field_0 + lVar11 + uVar12 * 4);
        if (((fVar14 < fVar15) && (fVar15 < fVar16)) || ((fVar15 < fVar14 && (fVar16 < fVar15)))) {
          fVar14 = (fVar15 - fVar14) * (1.0 / (fVar16 - fVar14));
          pfVar2 = (float *)((long)&splitter->v[0].field_0 + lVar11);
          pfVar1 = (float *)((long)&splitter->v[1].field_0 + lVar11);
          fVar16 = (*pfVar1 - *pfVar2) * fVar14 + *pfVar2;
          fVar24 = (pfVar1[1] - pfVar2[1]) * fVar14 + pfVar2[1];
          fVar20 = (pfVar1[2] - pfVar2[2]) * fVar14 + pfVar2[2];
          fVar14 = (pfVar1[3] - pfVar2[3]) * fVar14 + pfVar2[3];
          auVar28._4_4_ = fVar24;
          auVar28._0_4_ = fVar16;
          auVar28._8_4_ = fVar20;
          auVar28._12_4_ = fVar14;
          auVar27 = minps(auVar27,auVar28);
          auVar5._4_4_ = fVar24;
          auVar5._0_4_ = fVar16;
          auVar5._8_4_ = fVar20;
          auVar5._12_4_ = fVar14;
          auVar26 = maxps(auVar26,auVar5);
          auVar6._4_4_ = fVar24;
          auVar6._0_4_ = fVar16;
          auVar6._8_4_ = fVar20;
          auVar6._12_4_ = fVar14;
          auVar22 = minps(auVar22,auVar6);
          auVar7._4_4_ = fVar24;
          auVar7._0_4_ = fVar16;
          auVar7._8_4_ = fVar20;
          auVar7._12_4_ = fVar14;
          auVar17 = maxps(auVar17,auVar7);
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x30);
      auVar9._4_4_ = fStack_9c;
      auVar9._0_4_ = local_a0;
      auVar9._8_4_ = fStack_98;
      auVar9._12_4_ = fStack_94;
      auVar28 = maxps(auVar27,auVar9);
      auVar27._4_4_ = fStack_ac;
      auVar27._0_4_ = local_b0;
      auVar27._8_4_ = fStack_a8;
      auVar27._12_4_ = fStack_a4;
      auVar26 = minps(auVar26,auVar27);
      uVar3 = *(undefined4 *)((long)&(prim->lower).field_0 + 0xc);
      uVar4 = *(undefined4 *)((long)&(prim->upper).field_0 + 0xc);
      local_e0._0_12_ = auVar28._0_12_;
      local_e0.m128[3] = (float)uVar3;
      local_d0._0_12_ = auVar26._0_12_;
      local_d0._12_4_ = uVar4;
      auVar22 = maxps(auVar22,auVar9);
      auVar17 = minps(auVar17,auVar27);
      local_80._0_12_ = auVar22._0_12_;
      local_80.m128[3] = (float)uVar3;
      local_70._0_12_ = auVar17._0_12_;
      local_70._12_4_ = uVar4;
      splitPrimitive<embree::sse2::TriangleSplitter>
                (splitter,(PrimRef *)&local_e0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
      splitPrimitive<embree::sse2::TriangleSplitter>
                (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
                 numSubPrims);
      return;
    }
    uVar21 = *numSubPrims;
    *numSubPrims = uVar21 + 1;
  }
  uVar8 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
  *(undefined8 *)&subPrims[uVar21].lower.field_0 = *(undefined8 *)&(prim->lower).field_0;
  *(undefined8 *)((long)&subPrims[uVar21].lower.field_0 + 8) = uVar8;
  uVar8 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
  *(undefined8 *)&subPrims[uVar21].upper.field_0 = *(undefined8 *)&(prim->upper).field_0;
  *(undefined8 *)((long)&subPrims[uVar21].upper.field_0 + 8) = uVar8;
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }